

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyHaig.c
# Opt level: O1

void Ivy_ManHaigTrasfer(Ivy_Man_t *p,Ivy_Man_t *pNew)

{
  uint uVar1;
  Ivy_Man_t *pIVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Ptr_t *pVVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  pIVar2 = p->pHaig;
  if (pIVar2 == (Ivy_Man_t *)0x0) {
    __assert_fail("p->pHaig != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyHaig.c"
                  ,0x8d,"void Ivy_ManHaigTrasfer(Ivy_Man_t *, Ivy_Man_t *)");
  }
  pNew->pConst1->pEquiv = p->pConst1->pEquiv;
  pVVar3 = pNew->vPis;
  uVar5 = (ulong)pVVar3->nSize;
  if (0 < (long)uVar5) {
    pVVar4 = p->vPis;
    uVar1 = pVVar4->nSize;
    uVar7 = 0;
    uVar6 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar6 = uVar7;
    }
    do {
      if (uVar6 == uVar7) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      *(undefined8 *)((long)pVVar3->pArray[uVar7] + 0x48) =
           *(undefined8 *)((long)pVVar4->pArray[uVar7] + 0x48);
      uVar7 = uVar7 + 1;
    } while (uVar5 != uVar7);
  }
  pNew->pHaig = pIVar2;
  return;
}

Assistant:

void Ivy_ManHaigTrasfer( Ivy_Man_t * p, Ivy_Man_t * pNew )
{
    Ivy_Obj_t * pObj;
    int i;
    assert( p->pHaig != NULL );
    Ivy_ManConst1(pNew)->pEquiv = Ivy_ManConst1(p)->pEquiv;
    Ivy_ManForEachPi( pNew, pObj, i )
        pObj->pEquiv = Ivy_ManPi( p, i )->pEquiv;
    pNew->pHaig = p->pHaig;
}